

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigurationGroup.cpp
# Opt level: O0

Pair<Corrade::Containers::BasicStringView<const_char>,_Corrade::Containers::BasicStringView<const_char>_>
* __thiscall
Corrade::Utility::ConfigurationGroup::ValueIterator::operator*
          (Pair<Corrade::Containers::BasicStringView<const_char>,_Corrade::Containers::BasicStringView<const_char>_>
           *__return_storage_ptr__,ValueIterator *this)

{
  BasicStringView<const_char> local_30;
  BasicStringView<const_char> local_20;
  ValueIterator *local_10;
  ValueIterator *this_local;
  
  local_10 = this;
  Containers::BasicStringView<char_const>::
  BasicStringView<std::__cxx11::string_const&,Corrade::Containers::BasicStringView<char_const>>
            ((BasicStringView<char_const> *)&local_20,&this->_value->key);
  Containers::BasicStringView<char_const>::
  BasicStringView<std::__cxx11::string_const&,Corrade::Containers::BasicStringView<char_const>>
            ((BasicStringView<char_const> *)&local_30,&this->_value->value);
  Containers::
  Pair<Corrade::Containers::BasicStringView<const_char>,_Corrade::Containers::BasicStringView<const_char>_>
  ::Pair(__return_storage_ptr__,&local_20,&local_30);
  return __return_storage_ptr__;
}

Assistant:

Containers::Pair<Containers::StringView, Containers::StringView> ConfigurationGroup::ValueIterator::operator*() const {
    return {_value->key, _value->value};
}